

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

size_t mime_subparts_read(char *buffer,size_t size,size_t nitems,void *instream)

{
  curl_mimepart *part_00;
  size_t numbytes;
  char *trail;
  curl_mimepart *local_88;
  curl_mimepart *part;
  size_t sz;
  size_t cursize;
  curl_mime *mime;
  void *instream_local;
  size_t nitems_local;
  size_t size_local;
  char *buffer_local;
  
  sz = 0;
  instream_local = (void *)nitems;
  size_local = (size_t)buffer;
  do {
    if (instream_local == (void *)0x0) {
      return sz;
    }
    part = (curl_mimepart *)0x0;
    part_00 = *(curl_mimepart **)((long)instream + 0x58);
    switch(*(undefined4 *)((long)instream + 0x50)) {
    case 0:
    case 4:
      mimesetstate((mime_state *)((long)instream + 0x50),MIMESTATE_BOUNDARY1,
                   *(void **)((long)instream + 0x10));
      *(long *)((long)instream + 0x60) = *(long *)((long)instream + 0x60) + 2;
      break;
    default:
      break;
    case 5:
      part = (curl_mimepart *)
             readback_bytes((mime_state *)((long)instream + 0x50),(char *)size_local,
                            (size_t)instream_local,"\r\n--",4,"");
      if (part == (curl_mimepart *)0x0) {
        mimesetstate((mime_state *)((long)instream + 0x50),MIMESTATE_BOUNDARY2,part_00);
      }
      break;
    case 6:
      numbytes = strlen((char *)((long)instream + 0x20));
      trail = "--\r\n";
      if (part_00 != (curl_mimepart *)0x0) {
        trail = "\r\n";
      }
      part = (curl_mimepart *)
             readback_bytes((mime_state *)((long)instream + 0x50),(char *)size_local,
                            (size_t)instream_local,(char *)((long)instream + 0x20),numbytes,trail);
      if (part == (curl_mimepart *)0x0) {
        mimesetstate((mime_state *)((long)instream + 0x50),MIMESTATE_CONTENT,part_00);
      }
      break;
    case 7:
      if (part_00 == (curl_mimepart *)0x0) {
        mimesetstate((mime_state *)((long)instream + 0x50),MIMESTATE_END,(void *)0x0);
      }
      else {
        local_88 = (curl_mimepart *)readback_part(part_00,(char *)size_local,(size_t)instream_local)
        ;
        if (local_88 == (curl_mimepart *)0xffffffffffffffff) {
LAB_007e7f92:
          if (sz != 0) {
            local_88 = (curl_mimepart *)sz;
          }
          return (size_t)local_88;
        }
        part = local_88;
        if (local_88 == (curl_mimepart *)0x0) {
          mimesetstate((mime_state *)((long)instream + 0x50),MIMESTATE_BOUNDARY1,part_00->nextpart);
        }
        else if (local_88[-0x92493].encstate.buf + 0x80 < (char *)0x2) goto LAB_007e7f92;
      }
      break;
    case 8:
      return sz;
    }
    sz = (long)&part->easy + sz;
    size_local = (long)&part->easy + size_local;
    instream_local = (void *)((long)instream_local - (long)part);
  } while( true );
}

Assistant:

static size_t mime_subparts_read(char *buffer, size_t size, size_t nitems,
                                 void *instream)
{
  curl_mime *mime = (curl_mime *) instream;
  size_t cursize = 0;
#ifdef CURL_DOES_CONVERSIONS
  char *convbuf = buffer;
#endif

  (void) size;   /* Always 1. */

  while(nitems) {
    size_t sz = 0;
    curl_mimepart *part = mime->state.ptr;
    switch(mime->state.state) {
    case MIMESTATE_BEGIN:
    case MIMESTATE_BODY:
#ifdef CURL_DOES_CONVERSIONS
      convbuf = buffer;
#endif
      mimesetstate(&mime->state, MIMESTATE_BOUNDARY1, mime->firstpart);
      /* The first boundary always follows the header termination empty line,
         so is always preceded by a CRLK. We can then spare 2 characters
         by skipping the leading CRLF in boundary. */
      mime->state.offset += 2;
      break;
    case MIMESTATE_BOUNDARY1:
      sz = readback_bytes(&mime->state, buffer, nitems, "\r\n--", 4, "");
      if(!sz)
        mimesetstate(&mime->state, MIMESTATE_BOUNDARY2, part);
      break;
    case MIMESTATE_BOUNDARY2:
      sz = readback_bytes(&mime->state, buffer, nitems, mime->boundary,
                          strlen(mime->boundary), part? "\r\n": "--\r\n");
      if(!sz) {
#ifdef CURL_DOES_CONVERSIONS
        if(mime->easy && convbuf < buffer) {
          CURLcode result = Curl_convert_to_network(mime->easy, convbuf,
                                                    buffer - convbuf);
          if(result)
            return READ_ERROR;
          convbuf = buffer;
        }
#endif
        mimesetstate(&mime->state, MIMESTATE_CONTENT, part);
      }
      break;
    case MIMESTATE_CONTENT:
      if(!part) {
        mimesetstate(&mime->state, MIMESTATE_END, NULL);
        break;
      }
      sz = readback_part(part, buffer, nitems);
      switch(sz) {
      case CURL_READFUNC_ABORT:
      case CURL_READFUNC_PAUSE:
      case READ_ERROR:
        return cursize? cursize: sz;
      case 0:
#ifdef CURL_DOES_CONVERSIONS
        convbuf = buffer;
#endif
        mimesetstate(&mime->state, MIMESTATE_BOUNDARY1, part->nextpart);
        break;
      }
      break;
    case MIMESTATE_END:
      return cursize;
    default:
      break;    /* other values not used in mime state. */
    }

    /* Bump buffer and counters according to read size. */
    cursize += sz;
    buffer += sz;
    nitems -= sz;
  }

#ifdef CURL_DOES_CONVERSIONS
      if(mime->easy && convbuf < buffer &&
         mime->state.state <= MIMESTATE_CONTENT) {
        CURLcode result = Curl_convert_to_network(mime->easy, convbuf,
                                                  buffer - convbuf);
        if(result)
          return READ_ERROR;
      }
#endif

  return cursize;
}